

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

String * __thiscall List<String>::operator[](List<String> *this,int n)

{
  int iVar1;
  const_reference pvVar2;
  int local_18;
  int local_14;
  List<String> *pLStack_10;
  int n_local;
  List<String> *this_local;
  
  local_14 = n;
  pLStack_10 = this;
  iVar1 = size(this);
  if (iVar1 <= n) {
    local_18 = size(this);
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:264: n (%1) is not less than size() (%2)"
                   ,&local_14,&local_18);
  }
  pvVar2 = std::deque<String,_std::allocator<String>_>::operator[](&this->_deque,(long)local_14);
  return pvVar2;
}

Assistant:

inline const T& List<T>::operator[] (int n) const
{
	ASSERT_LT (n, size());
	return _deque[n];
}